

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTDMT_waitForLdmComplete(ZSTDMT_CCtx *mtctx,buffer_t buffer)

{
  int iVar1;
  pthread_mutex_t *__mutex;
  pthread_mutex_t *mutex;
  ZSTDMT_CCtx *mtctx_local;
  buffer_t buffer_local;
  
  if ((mtctx->params).ldmParams.enableLdm != 0) {
    __mutex = &(mtctx->serial).ldmWindowMutex;
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    while( true ) {
      iVar1 = ZSTDMT_doesOverlapWindow(buffer,(mtctx->serial).ldmWindow);
      if (iVar1 == 0) break;
      pthread_cond_wait((pthread_cond_t *)&(mtctx->serial).ldmWindowCond,(pthread_mutex_t *)__mutex)
      ;
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  return;
}

Assistant:

static void ZSTDMT_waitForLdmComplete(ZSTDMT_CCtx* mtctx, buffer_t buffer)
{
    if (mtctx->params.ldmParams.enableLdm) {
        ZSTD_pthread_mutex_t* mutex = &mtctx->serial.ldmWindowMutex;
        DEBUGLOG(5, "ZSTDMT_waitForLdmComplete");
        DEBUGLOG(5, "source  [0x%zx, 0x%zx)",
                    (size_t)buffer.start,
                    (size_t)buffer.start + buffer.capacity);
        ZSTD_PTHREAD_MUTEX_LOCK(mutex);
        while (ZSTDMT_doesOverlapWindow(buffer, mtctx->serial.ldmWindow)) {
            DEBUGLOG(5, "Waiting for LDM to finish...");
            ZSTD_pthread_cond_wait(&mtctx->serial.ldmWindowCond, mutex);
        }
        DEBUGLOG(6, "Done waiting for LDM to finish");
        ZSTD_pthread_mutex_unlock(mutex);
    }
}